

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_ls_embd_s * fio_ls_embd_remove(fio_ls_embd_s *node)

{
  fio_ls_embd_s *node_local;
  
  if ((node->next == (fio_ls_embd_s *)0x0) || (node->next == node)) {
    node_local = (fio_ls_embd_s *)0x0;
  }
  else {
    node->next->prev = node->prev;
    node->prev->next = node->next;
    node->next = node;
    node->prev = node;
    node_local = node;
  }
  return node_local;
}

Assistant:

FIO_FUNC inline fio_ls_embd_s *fio_ls_embd_remove(fio_ls_embd_s *node) {
  if (!node->next || node->next == node) {
    /* never remove the list's head */
    return NULL;
  }
  node->next->prev = node->prev;
  node->prev->next = node->next;
  node->prev = node->next = node;
  return node;
}